

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluProgramInterfaceQuery.cpp
# Opt level: O0

void glu::getProgramInterfaceBlockInfo
               (Functions *gl,deUint32 program,deUint32 programInterface,deUint32 index,
               InterfaceBlockInfo *info)

{
  deUint32 dVar1;
  InterfaceBlockInfo *info_local;
  deUint32 index_local;
  deUint32 programInterface_local;
  deUint32 program_local;
  Functions *gl_local;
  
  info->index = index;
  dVar1 = getProgramResourceUint(gl,program,programInterface,index,0x9302);
  info->bufferBinding = dVar1;
  dVar1 = getProgramResourceUint(gl,program,programInterface,index,0x9303);
  info->dataSize = dVar1;
  getProgramInterfaceActiveVariables(gl,program,programInterface,index,&info->activeVariables);
  if (programInterface != 0x92c0) {
    getProgramResourceName(gl,program,programInterface,index,&info->name);
  }
  return;
}

Assistant:

void getProgramInterfaceBlockInfo (const glw::Functions& gl, deUint32 program, deUint32 programInterface, deUint32 index, InterfaceBlockInfo& info)
{
	info.index			= index;
	info.bufferBinding	= getProgramResourceUint(gl, program, programInterface, index, GL_BUFFER_BINDING);
	info.dataSize		= getProgramResourceUint(gl, program, programInterface, index, GL_BUFFER_DATA_SIZE);

	getProgramInterfaceActiveVariables(gl, program, programInterface, index, info.activeVariables);

	if (programInterface != GL_ATOMIC_COUNTER_BUFFER)
		getProgramResourceName(gl, program, programInterface, index, info.name);
}